

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O2

shared_ptr<mcc::ControlFlow> __thiscall mcc::Parser::BreakStatement(Parser *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  TokenType in_ESI;
  shared_ptr<mcc::ControlFlow> sVar1;
  allocator<char> local_51;
  shared_ptr<mcc::Token> token;
  string local_40 [32];
  
  Consume((Parser *)&token,in_ESI);
  std::__cxx11::string::string<std::allocator<char>>
            (local_40,"Expected \';\' after \'break\' statement",&local_51);
  Consume((Parser *)&stack0xffffffffffffffe0,in_ESI,(string *)0x6);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe8);
  std::__cxx11::string::~string(local_40);
  local_40[0] = (string)0x1;
  std::make_shared<mcc::ControlFlow,std::shared_ptr<mcc::Token>&,bool>
            ((shared_ptr<mcc::Token> *)this,(bool *)&token);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&token.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  sVar1.super___shared_ptr<mcc::ControlFlow,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<mcc::ControlFlow,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mcc::ControlFlow>)
         sVar1.super___shared_ptr<mcc::ControlFlow,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ControlFlow> Parser::BreakStatement() {
  std::shared_ptr<Token> token = Consume(TokenType::T_BREAK);
  Consume(TokenType::T_SEMICOLON, "Expected ';' after 'break' statement");
  return std::make_shared<ControlFlow>(token, true);
}